

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Str.cpp
# Opt level: O2

void __thiscall mbc::Val::Str::~Str(Str *this)

{
  string *this_00;
  
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__Str_0013e968;
  if (*(this->super__ValAtom).super_ValBase.count_ == 1) {
    this_00 = this->value_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00);
  }
  _ValAtom::~_ValAtom(&this->super__ValAtom);
  return;
}

Assistant:

Str::~Str() {
    if(*count_ == 1) {
        delete value_;
    }
}